

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

string * __thiscall
Parameter<unsigned_long>::getParamType_abi_cxx11_
          (string *__return_storage_ptr__,Parameter<unsigned_long> *this)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_18 = 0x11;
  pcVar1 = (char *)std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_18)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"unsigned long int",0x11);
  __return_storage_ptr__->_M_string_length = local_18;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }